

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_avgdev.c
# Opt level: O0

ErrorNumber test_func_avgdev(TA_History *history)

{
  ErrorNumber EVar1;
  uint *in_RDI;
  ErrorNumber retValue;
  uint i;
  TA_Test_conflict3 *in_stack_00000010;
  TA_History *in_stack_00000018;
  uint local_14;
  
  local_14 = 0;
  while( true ) {
    if (2 < local_14) {
      return TA_TEST_PASS;
    }
    if ((int)*in_RDI < tableTest[local_14].expectedNbElement) break;
    EVar1 = do_test(in_stack_00000018,in_stack_00000010);
    if (EVar1 != TA_TEST_PASS) {
      printf("%s Failed Test #%d (Code=%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_avgdev.c"
             ,(ulong)local_14,(ulong)EVar1);
      return EVar1;
    }
    local_14 = local_14 + 1;
  }
  printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_avgdev.c"
         ,(ulong)local_14,(ulong)(uint)tableTest[local_14].expectedNbElement,(ulong)*in_RDI);
  return TA_TESTUTIL_TFRR_BAD_PARAM;
}

Assistant:

ErrorNumber test_func_avgdev( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n", __FILE__,
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n", __FILE__,
                 i, retValue );
         return retValue;
      }
   }

   /* All test succeed. */
   return TA_TEST_PASS;
}